

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlSkipBlankCharsPE(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlEntityType xVar2;
  xmlEntityPtr pxVar3;
  byte *pbVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  bool bVar8;
  bool bVar9;
  
  pxVar3 = ctxt->input->entity;
  if (pxVar3 == (xmlEntityPtr)0x0) {
    bVar9 = ctxt->inSubset == 2;
    bVar8 = false;
  }
  else {
    xVar2 = pxVar3->etype;
    bVar8 = (xVar2 & ~XML_INTERNAL_GENERAL_ENTITY) == XML_INTERNAL_PARAMETER_ENTITY;
    bVar9 = true;
    if (ctxt->inSubset == 2) goto LAB_00136f8d;
    bVar9 = xVar2 == XML_EXTERNAL_PARAMETER_ENTITY;
  }
  if (!(bool)(bVar8 | bVar9)) {
    iVar5 = xmlSkipBlankChars(ctxt);
    return iVar5;
  }
LAB_00136f8d:
  iVar5 = 0;
  do {
    iVar7 = iVar5;
    if (1 < ctxt->disableSAX) {
      return iVar7;
    }
    pbVar4 = ctxt->input->cur;
    bVar1 = *pbVar4;
    uVar6 = (ulong)bVar1;
    if (uVar6 < 0x26) {
      if ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0) {
        if (uVar6 != 0x25) goto LAB_0013700f;
        if (!bVar9) {
          return iVar7;
        }
        uVar6 = (ulong)pbVar4[1];
        if ((uVar6 < 0x21) && ((0x100002601U >> (uVar6 & 0x3f) & 1) != 0)) {
          return iVar7;
        }
        xmlParsePEReference(ctxt);
        goto LAB_00137020;
      }
      xmlNextChar(ctxt);
    }
    else {
LAB_0013700f:
      if (bVar1 != 0) {
        return iVar7;
      }
      if (!bVar8) {
        return iVar7;
      }
      xmlPopPE(ctxt);
LAB_00137020:
      pxVar3 = ctxt->input->entity;
      if (pxVar3 == (xmlEntityPtr)0x0) {
        bVar9 = ctxt->inSubset == 2;
        bVar8 = false;
      }
      else {
        xVar2 = pxVar3->etype;
        bVar8 = (xVar2 & ~XML_INTERNAL_GENERAL_ENTITY) == XML_INTERNAL_PARAMETER_ENTITY;
        if (ctxt->inSubset == 2) {
          bVar9 = true;
        }
        else {
          bVar9 = xVar2 == XML_EXTERNAL_PARAMETER_ENTITY;
        }
      }
    }
    iVar5 = iVar7 + 1;
    if (iVar7 == 0x7fffffff) {
      iVar5 = iVar7;
    }
  } while( true );
}

Assistant:

static int
xmlSkipBlankCharsPE(xmlParserCtxtPtr ctxt) {
    int res = 0;
    int inParam;
    int expandParam;

    inParam = PARSER_IN_PE(ctxt);
    expandParam = PARSER_EXTERNAL(ctxt);

    if (!inParam && !expandParam)
        return(xmlSkipBlankChars(ctxt));

    /*
     * It's Okay to use CUR/NEXT here since all the blanks are on
     * the ASCII range.
     */
    while (PARSER_STOPPED(ctxt) == 0) {
        if (IS_BLANK_CH(CUR)) { /* CHECKED tstblanks.xml */
            NEXT;
        } else if (CUR == '%') {
            if ((expandParam == 0) ||
                (IS_BLANK_CH(NXT(1))) || (NXT(1) == 0))
                break;

            /*
             * Expand parameter entity. We continue to consume
             * whitespace at the start of the entity and possible
             * even consume the whole entity and pop it. We might
             * even pop multiple PEs in this loop.
             */
            xmlParsePEReference(ctxt);

            inParam = PARSER_IN_PE(ctxt);
            expandParam = PARSER_EXTERNAL(ctxt);
        } else if (CUR == 0) {
            if (inParam == 0)
                break;

            xmlPopPE(ctxt);

            inParam = PARSER_IN_PE(ctxt);
            expandParam = PARSER_EXTERNAL(ctxt);
        } else {
            break;
        }

        /*
         * Also increase the counter when entering or exiting a PERef.
         * The spec says: "When a parameter-entity reference is recognized
         * in the DTD and included, its replacement text MUST be enlarged
         * by the attachment of one leading and one following space (#x20)
         * character."
         */
        if (res < INT_MAX)
            res++;
    }

    return(res);
}